

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void calculate_path_table_size(vdd *vdd)

{
  isoent *piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = (ulong)(uint)vdd->max_depth;
  if (vdd->max_depth < 1) {
    uVar3 = 0;
  }
  iVar2 = 0;
  for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    uVar5 = vdd->pathtbl[uVar6].cnt;
    if (uVar5 == 0) break;
    uVar7 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar7 = 0;
    }
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      piVar1 = vdd->pathtbl[uVar6].sorted[uVar4];
      uVar5 = 1;
      if (piVar1->identifier != (char *)0x0) {
        uVar5 = piVar1->id_len;
      }
      iVar2 = iVar2 + uVar5 + (uVar5 & 1) + 8;
    }
  }
  vdd->path_table_size = iVar2;
  vdd->path_table_block = ((iVar2 + 0xfff) / 0x1000) * 2;
  return;
}

Assistant:

static void
calculate_path_table_size(struct vdd *vdd)
{
	int depth, size;
	struct path_table *pt;

	pt = vdd->pathtbl;
	size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		struct isoent **ptbl;
		int i, cnt;

		if ((cnt = pt[depth].cnt) == 0)
			break;

		ptbl = pt[depth].sorted;
		for (i = 0; i < cnt; i++) {
			int len;

			if (ptbl[i]->identifier == NULL)
				len = 1; /* root directory */
			else
				len = ptbl[i]->id_len;
			if (len & 0x01)
				len++; /* Padding Field */
			size += 8 + len;
		}
	}
	vdd->path_table_size = size;
	vdd->path_table_block =
	    ((size + PATH_TABLE_BLOCK_SIZE -1) /
	    PATH_TABLE_BLOCK_SIZE) *
	    (PATH_TABLE_BLOCK_SIZE / LOGICAL_BLOCK_SIZE);
}